

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ExprIfTrue(Parse *pParse,Expr *pExpr,int dest,int jumpIfNull)

{
  char cVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  Parse *pPVar5;
  int in_ECX;
  Vdbe *p;
  int in_EDX;
  Parse *in_RSI;
  Parse *in_RDI;
  long in_FS_OFFSET;
  int destIfNull;
  int destIfFalse;
  int isTrue;
  int isNot;
  int d2;
  Expr *pAlt;
  int in_stack_00000048;
  int r2;
  int r1;
  int op;
  Vdbe *v;
  int regFree2;
  int regFree1;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffc0;
  int iVar6;
  undefined4 uVar7;
  int iVar8;
  Parse *pParse_00;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pParse_00 = (Parse *)in_RDI->pVdbe;
  uVar7 = 0xaaaaaaaa;
  iVar6 = -0x55555556;
  if ((pParse_00 == (Parse *)0x0) || (in_RSI == (Parse *)0x0)) goto LAB_001d5c01;
  uVar3 = (uint)*(byte *)&in_RSI->db;
  p = (Vdbe *)(ulong)(uVar3 - 0x13);
  switch(p) {
  case (Vdbe *)0x0:
    sqlite3ExprIfFalse(pParse_00,(Expr *)(ulong)CONCAT14(*(byte *)&in_RSI->db,0xaaaaaaaa),
                       -0x55555556,in_stack_ffffffffffffffc0);
    break;
  default:
    goto LAB_001d5b6a;
  case (Vdbe *)0x18:
  case (Vdbe *)0x19:
    pPVar5 = (Parse *)sqlite3ExprSimplifiedAndOr
                                ((Expr *)CONCAT44(in_stack_ffffffffffffff94,
                                                  in_stack_ffffffffffffff90));
    iVar8 = (int)((ulong)pParse_00 >> 0x20);
    if (pPVar5 == in_RSI) {
      if (uVar3 == 0x2c) {
        sqlite3VdbeMakeLabel(in_RDI);
        sqlite3ExprIfFalse(pParse_00,(Expr *)CONCAT44(uVar3,uVar7),iVar6,in_stack_ffffffffffffffc0);
        sqlite3ExprIfTrue(in_RSI,(Expr *)CONCAT44(in_EDX,in_ECX),(int)((ulong)pParse_00 >> 0x20),
                          (int)pParse_00);
        sqlite3VdbeResolveLabel
                  ((Vdbe *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff8c);
      }
      else {
        sqlite3ExprIfTrue(in_RSI,(Expr *)CONCAT44(in_EDX,in_ECX),iVar8,(int)pParse_00);
        sqlite3ExprIfTrue(in_RSI,(Expr *)CONCAT44(in_EDX,in_ECX),(int)((ulong)pParse_00 >> 0x20),
                          (int)pParse_00);
      }
    }
    else {
      sqlite3ExprIfTrue(in_RSI,(Expr *)CONCAT44(in_EDX,in_ECX),iVar8,(int)pParse_00);
    }
    break;
  case (Vdbe *)0x1a:
  case (Vdbe *)0x1b:
  case (Vdbe *)0x22:
  case (Vdbe *)0x23:
  case (Vdbe *)0x24:
  case (Vdbe *)0x25:
  case (Vdbe *)0x26:
  case (Vdbe *)0x27:
    iVar6 = sqlite3ExprIsVector((Expr *)0x1d59fb);
    iVar8 = (int)pParse_00;
    if (iVar6 == 0) {
      iVar6 = sqlite3ExprCodeTemp((Parse *)CONCAT44(in_stack_ffffffffffffff94,
                                                    in_stack_ffffffffffffff90),
                                  (Expr *)CONCAT44(in_stack_ffffffffffffff8c,
                                                   in_stack_ffffffffffffff88),
                                  (int *)CONCAT44(in_stack_ffffffffffffff84,
                                                  in_stack_ffffffffffffff80));
      sqlite3ExprCodeTemp((Parse *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                          (Expr *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                          (int *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      codeCompare((Parse *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                  (Expr *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),(Expr *)p,
                  in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                  in_stack_ffffffffffffffc0,iVar6,iVar8);
    }
    else {
LAB_001d5b6a:
      if (((ulong)in_RSI->db & 0x1000000100000000) == 0x1000000000000000) {
        sqlite3VdbeGoto((Vdbe *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                        in_stack_ffffffffffffff7c);
      }
      else if (((ulong)in_RSI->db & 0x2000000100000000) != 0x2000000000000000) {
        sqlite3ExprCodeTemp((Parse *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                            (Expr *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                            (int *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        sqlite3VdbeAddOp3(p,in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,
                          in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
      }
    }
    break;
  case (Vdbe *)0x1e:
    exprCodeBetween((Parse *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                    (Expr *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),0,
                    (_func_void_Parse_ptr_Expr_ptr_int_int *)
                    CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    in_stack_ffffffffffffff8c);
    break;
  case (Vdbe *)0x1f:
    iVar6 = sqlite3VdbeMakeLabel(in_RDI);
    if (in_ECX != 0) {
      iVar6 = in_EDX;
    }
    sqlite3ExprCodeIN((Parse *)v,_r1,r2,in_stack_00000048);
    sqlite3VdbeGoto((Vdbe *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                    in_stack_ffffffffffffff7c);
    sqlite3VdbeResolveLabel
              ((Vdbe *)CONCAT44(iVar6,in_stack_ffffffffffffff90),in_stack_ffffffffffffff8c);
    break;
  case (Vdbe *)0x20:
  case (Vdbe *)0x21:
    sqlite3ExprCodeTemp((Parse *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                        (Expr *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                        (int *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    sqlite3VdbeTypeofColumn
              ((Vdbe *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff7c);
    sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,0);
    break;
  case (Vdbe *)0x9c:
    cVar1 = *(char *)((long)&in_RSI->db + 2);
    uVar4 = sqlite3ExprTruthValue((Expr *)0x1d5961);
    if (uVar4 == (cVar1 == '.')) {
      sqlite3ExprIfFalse(pParse_00,(Expr *)CONCAT44(uVar3,uVar7),iVar6,in_stack_ffffffffffffffc0);
    }
    else {
      sqlite3ExprIfTrue(in_RSI,(Expr *)CONCAT44(in_EDX,in_ECX),(int)((ulong)pParse_00 >> 0x20),
                        (int)pParse_00);
    }
  }
  sqlite3ReleaseTempReg(in_RDI,0);
  sqlite3ReleaseTempReg(in_RDI,0);
LAB_001d5c01:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprIfTrue(Parse *pParse, Expr *pExpr, int dest, int jumpIfNull){
  Vdbe *v = pParse->pVdbe;
  int op = 0;
  int regFree1 = 0;
  int regFree2 = 0;
  int r1, r2;

  assert( jumpIfNull==SQLITE_JUMPIFNULL || jumpIfNull==0 );
  if( NEVER(v==0) )     return;  /* Existence of VDBE checked by caller */
  if( NEVER(pExpr==0) ) return;  /* No way this can happen */
  assert( !ExprHasVVAProperty(pExpr, EP_Immutable) );
  op = pExpr->op;
  switch( op ){
    case TK_AND:
    case TK_OR: {
      Expr *pAlt = sqlite3ExprSimplifiedAndOr(pExpr);
      if( pAlt!=pExpr ){
        sqlite3ExprIfTrue(pParse, pAlt, dest, jumpIfNull);
      }else if( op==TK_AND ){
        int d2 = sqlite3VdbeMakeLabel(pParse);
        testcase( jumpIfNull==0 );
        sqlite3ExprIfFalse(pParse, pExpr->pLeft, d2,
                           jumpIfNull^SQLITE_JUMPIFNULL);
        sqlite3ExprIfTrue(pParse, pExpr->pRight, dest, jumpIfNull);
        sqlite3VdbeResolveLabel(v, d2);
      }else{
        testcase( jumpIfNull==0 );
        sqlite3ExprIfTrue(pParse, pExpr->pLeft, dest, jumpIfNull);
        sqlite3ExprIfTrue(pParse, pExpr->pRight, dest, jumpIfNull);
      }
      break;
    }
    case TK_NOT: {
      testcase( jumpIfNull==0 );
      sqlite3ExprIfFalse(pParse, pExpr->pLeft, dest, jumpIfNull);
      break;
    }
    case TK_TRUTH: {
      int isNot;      /* IS NOT TRUE or IS NOT FALSE */
      int isTrue;     /* IS TRUE or IS NOT TRUE */
      testcase( jumpIfNull==0 );
      isNot = pExpr->op2==TK_ISNOT;
      isTrue = sqlite3ExprTruthValue(pExpr->pRight);
      testcase( isTrue && isNot );
      testcase( !isTrue && isNot );
      if( isTrue ^ isNot ){
        sqlite3ExprIfTrue(pParse, pExpr->pLeft, dest,
                          isNot ? SQLITE_JUMPIFNULL : 0);
      }else{
        sqlite3ExprIfFalse(pParse, pExpr->pLeft, dest,
                           isNot ? SQLITE_JUMPIFNULL : 0);
      }
      break;
    }
    case TK_IS:
    case TK_ISNOT:
      testcase( op==TK_IS );
      testcase( op==TK_ISNOT );
      op = (op==TK_IS) ? TK_EQ : TK_NE;
      jumpIfNull = SQLITE_NULLEQ;
      /* no break */ deliberate_fall_through
    case TK_LT:
    case TK_LE:
    case TK_GT:
    case TK_GE:
    case TK_NE:
    case TK_EQ: {
      if( sqlite3ExprIsVector(pExpr->pLeft) ) goto default_expr;
      testcase( jumpIfNull==0 );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      r2 = sqlite3ExprCodeTemp(pParse, pExpr->pRight, &regFree2);
      codeCompare(pParse, pExpr->pLeft, pExpr->pRight, op,
                  r1, r2, dest, jumpIfNull, ExprHasProperty(pExpr,EP_Commuted));
      assert(TK_LT==OP_Lt); testcase(op==OP_Lt); VdbeCoverageIf(v,op==OP_Lt);
      assert(TK_LE==OP_Le); testcase(op==OP_Le); VdbeCoverageIf(v,op==OP_Le);
      assert(TK_GT==OP_Gt); testcase(op==OP_Gt); VdbeCoverageIf(v,op==OP_Gt);
      assert(TK_GE==OP_Ge); testcase(op==OP_Ge); VdbeCoverageIf(v,op==OP_Ge);
      assert(TK_EQ==OP_Eq); testcase(op==OP_Eq);
      VdbeCoverageIf(v, op==OP_Eq && jumpIfNull==SQLITE_NULLEQ);
      VdbeCoverageIf(v, op==OP_Eq && jumpIfNull!=SQLITE_NULLEQ);
      assert(TK_NE==OP_Ne); testcase(op==OP_Ne);
      VdbeCoverageIf(v, op==OP_Ne && jumpIfNull==SQLITE_NULLEQ);
      VdbeCoverageIf(v, op==OP_Ne && jumpIfNull!=SQLITE_NULLEQ);
      testcase( regFree1==0 );
      testcase( regFree2==0 );
      break;
    }
    case TK_ISNULL:
    case TK_NOTNULL: {
      assert( TK_ISNULL==OP_IsNull );   testcase( op==TK_ISNULL );
      assert( TK_NOTNULL==OP_NotNull ); testcase( op==TK_NOTNULL );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      sqlite3VdbeTypeofColumn(v, r1);
      sqlite3VdbeAddOp2(v, op, r1, dest);
      VdbeCoverageIf(v, op==TK_ISNULL);
      VdbeCoverageIf(v, op==TK_NOTNULL);
      testcase( regFree1==0 );
      break;
    }
    case TK_BETWEEN: {
      testcase( jumpIfNull==0 );
      exprCodeBetween(pParse, pExpr, dest, sqlite3ExprIfTrue, jumpIfNull);
      break;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_IN: {
      int destIfFalse = sqlite3VdbeMakeLabel(pParse);
      int destIfNull = jumpIfNull ? dest : destIfFalse;
      sqlite3ExprCodeIN(pParse, pExpr, destIfFalse, destIfNull);
      sqlite3VdbeGoto(v, dest);
      sqlite3VdbeResolveLabel(v, destIfFalse);
      break;
    }
#endif
    default: {
    default_expr:
      if( ExprAlwaysTrue(pExpr) ){
        sqlite3VdbeGoto(v, dest);
      }else if( ExprAlwaysFalse(pExpr) ){
        /* No-op */
      }else{
        r1 = sqlite3ExprCodeTemp(pParse, pExpr, &regFree1);
        sqlite3VdbeAddOp3(v, OP_If, r1, dest, jumpIfNull!=0);
        VdbeCoverage(v);
        testcase( regFree1==0 );
        testcase( jumpIfNull==0 );
      }
      break;
    }
  }
  sqlite3ReleaseTempReg(pParse, regFree1);
  sqlite3ReleaseTempReg(pParse, regFree2);
}